

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall
cppcms::widgets::base_widget::render_attributes(base_widget *this,form_context *context)

{
  ostream *poVar1;
  ostream *poVar2;
  char *pcVar3;
  
  auto_generate(this,context);
  poVar1 = form_context::out(context);
  if ((this->id_)._M_string_length != 0) {
    poVar2 = std::operator<<(poVar1,"id=\"");
    poVar2 = std::operator<<(poVar2,(string *)&this->id_);
    std::operator<<(poVar2,"\" ");
  }
  if ((this->name_)._M_string_length != 0) {
    poVar2 = std::operator<<(poVar1,"name=\"");
    poVar2 = std::operator<<(poVar2,(string *)&this->name_);
    std::operator<<(poVar2,"\" ");
  }
  if ((this->field_0x1f0 & 4) == 0) {
    return;
  }
  pcVar3 = "disabled ";
  if (context->html_type_ == 1) {
    pcVar3 = "disabled=\"disabled\" ";
  }
  std::operator<<(poVar1,pcVar3);
  return;
}

Assistant:

void base_widget::render_attributes(form_context &context)
{
	auto_generate(&context);
	std::ostream &output = context.out();
	if(!id_.empty()) output << "id=\"" << id_ << "\" ";
	if(!name_.empty()) output << "name=\"" << name_ << "\" ";
	if(disabled()) {
		if(context.html() == as_xhtml)
			output << "disabled=\"disabled\" ";
		else
			output << "disabled ";
	}
}